

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O0

void __thiscall
WriterTestHelper<unsigned_char,_1U,_33321U>::resize
          (WriterTestHelper<unsigned_char,_1U,_33321U> *this,createFlags flags,ktx_uint32_t layers,
          ktx_uint32_t faces,ktx_uint32_t dimensions,ktx_uint32_t w,ktx_uint32_t h,ktx_uint32_t d,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *requestedColor)

{
  uint uVar1;
  value_type vVar2;
  undefined4 uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference this_00;
  reference pvVar8;
  uchar *puVar9;
  size_t sVar10;
  undefined8 uVar11;
  byte bVar12;
  GLuint in_ECX;
  GLuint in_EDX;
  uint in_ESI;
  ulong __n;
  uint *in_RDI;
  GLuint in_R8D;
  ktx_uint32_t in_R9D;
  bool bVar13;
  ktx_uint32_t in_stack_00000008;
  ktx_uint32_t in_stack_00000010;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000018;
  ktxHashListEntry *pWriter;
  ktx_uint32_t ci;
  ktx_uint32_t j;
  ktx_uint32_t i_1;
  ktx_uint32_t pixelCount;
  ktx_uint32_t componentCount;
  ktx_uint32_t faceSlice;
  ktx_uint32_t numImages;
  ktx_uint32_t layer;
  ktx_uint32_t levelDepth;
  ktx_uint32_t levelHeight;
  ktx_uint32_t levelWidth;
  ktx_uint32_t count;
  ktx_uint32_t level;
  ktx_uint32_t i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> color;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  size_type in_stack_ffffffffffffff08;
  uint *puVar14;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_a8;
  undefined8 local_90;
  uint local_84;
  int local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  ktx_uint32_t local_24;
  GLuint local_20;
  GLuint local_1c;
  GLuint local_18;
  uint local_14;
  
  if (in_ECX != 1 && in_stack_00000010 != 1) {
    __assert_fail("faces == 1 || d == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x53,
                  "void WriterTestHelper<unsigned char, 1, 33321>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 1, internalformat = 33321]"
                 );
  }
  bVar13 = true;
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  if (in_stack_00000018 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_00000018);
    bVar13 = sVar4 != 0;
  }
  if (!bVar13) {
    __assert_fail("requestedColor == nullptr || requestedColor->size() >= numComponents",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/unittests/wthelper.h"
                  ,0x54,
                  "void WriterTestHelper<unsigned char, 1, 33321>::resize(createFlags, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, ktx_uint32_t, std::vector<component_type> *) [component_type = unsigned char, numComponents = 1, internalformat = 33321]"
                 );
  }
  in_RDI[3] = local_24;
  in_RDI[4] = in_stack_00000008;
  in_RDI[5] = in_stack_00000010;
  if ((local_14 & 1) == 0) {
    local_a8 = 1;
  }
  else {
    local_a8 = levelsFromSize(local_24,in_stack_00000008,in_stack_00000010);
  }
  *in_RDI = local_a8;
  in_RDI[1] = local_18;
  in_RDI[2] = local_1c;
  *(char *)(in_RDI + 6) = (char)((local_14 & 4) >> 2);
  texinfo::resize((texinfo *)(in_RDI + 0x3c),*in_RDI,local_18,local_1c,local_20,
                  (bool)((byte)in_RDI[6] & 1),local_24,in_stack_00000008,in_stack_00000010);
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  std::
  vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
           in_stack_ffffffffffffff08);
  std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::resize
            ((vector<wthImageInfo,_std::allocator<wthImageInfo>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15d88e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_stack_ffffffffffffff08
            );
  if (in_stack_00000018 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    for (local_50 = 0; local_50 == 0; local_50 = local_50 + 1) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (in_stack_00000018,0);
      vVar2 = *pvVar5;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&local_40,(ulong)local_50);
      *pvVar5 = vVar2;
    }
  }
  local_58 = 0;
  for (local_54 = 0; local_54 < *in_RDI; local_54 = local_54 + 1) {
    bVar12 = (byte)local_54;
    if (in_RDI[3] >> (bVar12 & 0x1f) == 0) {
      local_b8 = 1;
    }
    else {
      local_b8 = in_RDI[3] >> (bVar12 & 0x1f);
    }
    local_5c = local_b8;
    if (in_RDI[4] >> (bVar12 & 0x1f) == 0) {
      local_bc = 1;
    }
    else {
      local_bc = in_RDI[4] >> (bVar12 & 0x1f);
    }
    local_60 = local_bc;
    if (in_RDI[5] >> (bVar12 & 0x1f) == 0) {
      local_c0 = 1;
    }
    else {
      local_c0 = in_RDI[5] >> (bVar12 & 0x1f);
    }
    local_64 = local_c0;
    std::
    vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                  *)(in_RDI + 0x30),(ulong)local_54);
    std::
    vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
    ::resize((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08);
    for (local_68 = 0; local_68 < in_RDI[1]; local_68 = local_68 + 1) {
      if (in_RDI[2] == 6) {
        local_c4 = in_RDI[2];
      }
      else {
        local_c4 = local_64;
      }
      local_6c = local_c4;
      pvVar6 = std::
               vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                             *)(in_RDI + 0x30),(ulong)local_54);
      std::
      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::operator[](pvVar6,(ulong)local_68);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::resize((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
      for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
        local_78 = local_5c * local_60;
        local_74 = local_78;
        pvVar6 = std::
                 vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                               *)(in_RDI + 0x30),(ulong)local_54);
        pvVar7 = std::
                 vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator[](pvVar6,(ulong)local_68);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](pvVar7,(ulong)local_70);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08);
        if (in_stack_00000018 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
          vVar2 = (value_type)local_54;
          pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_40,0);
          *pvVar5 = vVar2;
        }
        for (local_7c = 0; uVar1 = local_78, local_7c < local_78; local_7c = local_7c + 1) {
          for (local_80 = 0; local_80 == 0; local_80 = local_80 + 1) {
            local_84 = local_7c;
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_40,0);
            vVar2 = *pvVar5;
            pvVar6 = std::
                     vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                                   *)(in_RDI + 0x30),(ulong)local_54);
            pvVar7 = std::
                     vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ::operator[](pvVar6,(ulong)local_68);
            this_00 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](pvVar7,(ulong)local_70);
            pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (this_00,(ulong)local_84);
            *pvVar5 = vVar2;
          }
        }
        pvVar8 = std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::operator[]
                           ((vector<wthImageInfo,_std::allocator<wthImageInfo>_> *)(in_RDI + 0x36),
                            (ulong)local_58);
        pvVar8->size = uVar1;
        pvVar8 = std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::operator[]
                           ((vector<wthImageInfo,_std::allocator<wthImageInfo>_> *)(in_RDI + 0x36),
                            (ulong)local_58);
        *(long *)(in_RDI + 0x2e) = (long)pvVar8->size + *(long *)(in_RDI + 0x2e);
        pvVar6 = std::
                 vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                 ::operator[]((vector<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                               *)(in_RDI + 0x30),(ulong)local_54);
        pvVar7 = std::
                 vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 ::operator[](pvVar6,(ulong)local_68);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator[](pvVar7,(ulong)local_70);
        puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15dd41);
        __n = (ulong)local_58;
        local_58 = local_58 + 1;
        pvVar8 = std::vector<wthImageInfo,_std::allocator<wthImageInfo>_>::operator[]
                           ((vector<wthImageInfo,_std::allocator<wthImageInfo>_> *)(in_RDI + 0x36),
                            __n);
        pvVar8->data = puVar9;
      }
    }
  }
  if (local_20 == 1) {
    snprintf((char *)(in_RDI + 0xb),0xf,"S=%c",0x72);
  }
  else if (local_20 == 2) {
    snprintf((char *)(in_RDI + 0xb),0xf,"S=%c,T=%c",0x72,100);
  }
  else if (local_20 == 3) {
    snprintf((char *)(in_RDI + 0xb),0xf,"S=%c,T=%c,R=%c",0x72,100,0x69);
  }
  *(undefined1 *)(in_RDI + 0x1c) = 0x72;
  *(undefined1 *)((long)in_RDI + 0x71) = 100;
  *(undefined1 *)((long)in_RDI + 0x72) = 0x69;
  *(undefined1 *)((long)in_RDI + 0x73) = 0;
  *(undefined1 *)((long)in_RDI + (ulong)local_20 + 0x70) = 0;
  ktxHashList_Construct(in_RDI + 0x18);
  sVar10 = strlen((char *)(in_RDI + 0xb));
  ktxHashList_AddKVPair(in_RDI + 0x18,"KTXorientation",(int)sVar10 + 1,in_RDI + 0xb);
  ktxHashList_Serialize(in_RDI + 0x18,in_RDI + 10,in_RDI + 8);
  ktxHashList_Construct(in_RDI + 0x1a);
  puVar14 = in_RDI + 0x1a;
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x1e);
  uVar3 = std::__cxx11::string::size();
  uVar11 = std::__cxx11::string::data();
  ktxHashList_AddKVPair(puVar14,"KTXwriter",uVar3,uVar11);
  ktxHashList_FindEntry(in_RDI + 0x1a,"KTXwriter",&local_90);
  appendLibId(in_RDI + 0x1a,local_90);
  ktxHashList_Serialize(in_RDI + 0x1a,in_RDI + 0x12,in_RDI + 0x10);
  ktxHashList_AddKVPair(in_RDI + 0x1a,"KTXorientation",local_20 + 1,in_RDI + 0x1c);
  ktxHashList_Sort(in_RDI + 0x1a);
  ktxHashList_Serialize(in_RDI + 0x1a,in_RDI + 0x16,in_RDI + 0x14);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_01);
  return;
}

Assistant:

void resize(createFlags flags,
                ktx_uint32_t layers, ktx_uint32_t faces,
                ktx_uint32_t dimensions,
                ktx_uint32_t w, ktx_uint32_t h, ktx_uint32_t d,
                std::vector<component_type>* requestedColor = nullptr)
    {
        assert(faces == 1 || d == 1);
        assert(requestedColor == nullptr || requestedColor->size() >= numComponents);

        this->width = w;
        this->height = h;
        this->depth = d;
        numLevels = flags & eMipmapped? levelsFromSize(w, h, d): 1;
        this->numLayers = layers;
        this->numFaces=faces;
        isArray = flags & eArray ? true : false;
        texinfo.resize(numLevels, layers, faces, dimensions,
                       isArray, w, h, d);

        // Create the image set.
        imageDataSize = 0;
        images.resize(numLevels);
        imageList.resize(numLevels * numLayers * numFaces * depth);
        std::vector<component_type> color;
        color.resize(numComponents);
        if (requestedColor != nullptr) {
            for (ktx_uint32_t i = 0; i < numComponents; i++) {
                color[i] = (*requestedColor)[i];
            }
        }
        for (ktx_uint32_t level = 0, count = 0; level < numLevels; level++) {
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            images[level].resize(numLayers);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                ktx_uint32_t numImages = numFaces == 6 ? numFaces : levelDepth;
                images[level][layer].resize(numImages);
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    ktx_uint32_t componentCount, pixelCount;
                    pixelCount = levelWidth * levelHeight;
                    componentCount = pixelCount * numComponents;
                    images[level][layer][faceSlice].resize(componentCount);
                    // Using std::vector avoids warnings in the following
                    // switch due to access past the end of the array, if we
                    // were using an array and numComponents < 4.
                    if (requestedColor == nullptr) {
                        switch (numComponents) {
                          case 4:
                            color[3] = (component_type)0.5;
                            FALLTHROUGH;
                          case 3:
                            color[2] = (component_type)faceSlice;
                            FALLTHROUGH;
                          case 2:
                            color[1] = (component_type)layer;
                            FALLTHROUGH;
                          case 1:
                            color[0] = (component_type)level;
                            break;
                        }
                    }
                    for (ktx_uint32_t i = 0; i < pixelCount; i++) {
                        for (ktx_uint32_t j = 0; j < numComponents; j++) {
                            ktx_uint32_t ci = i * numComponents + j;
                            images[level][layer][faceSlice][ci] = color[j];
                        }
                    }
                    imageList[count].size
                         = pixelCount * numComponents * sizeof(component_type);
                    imageDataSize += imageList[count].size;
                    imageList[count++].data
                         = (GLubyte*)images[level][layer][faceSlice].data();
                }
            }
        }

        switch (dimensions) {
          case 1:
            assert(strlen(KTX_ORIENTATION1_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION1_FMT,
                     'r');
            break;
          case 2:
            assert(strlen(KTX_ORIENTATION2_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION2_FMT,
                     'r', 'd');
            break;
          case 3:
            assert(strlen(KTX_ORIENTATION3_FMT) < sizeof(orientation));
            snprintf(orientation, sizeof(orientation), KTX_ORIENTATION3_FMT,
                     'r', 'd', 'i');
            break;
        }
        assert(4 <= sizeof(orientation_ktx2));
        orientation_ktx2[0] = 'r';
        orientation_ktx2[1] = 'd';
        orientation_ktx2[2] = 'i';
        orientation_ktx2[3] = 0;
        orientation_ktx2[dimensions] = 0; // Ensure terminating NULL.

        ktxHashList_Construct(&kvHash);
        ktxHashList_AddKVPair(&kvHash, KTX_ORIENTATION_KEY,
                              (unsigned int)strlen(orientation) + 1,
                              orientation);
        ktxHashList_Serialize(&kvHash, &kvDataLen, &kvData);


        ktxHashList_Construct(&kvHash_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_WRITER_KEY,
                              (ktx_uint32_t)writer_ktx2.size(),
                              writer_ktx2.data());

        // Get the library to add its Id to the writer key so it will be
        // included in the serialized data.
        ktxHashListEntry* pWriter;
        ktxHashList_FindEntry(&kvHash_ktx2, KTX_WRITER_KEY,
                              &pWriter);
        appendLibId(&kvHash_ktx2, pWriter);

        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenWriter_ktx2, &kvDataWriter_ktx2);
        ktxHashList_AddKVPair(&kvHash_ktx2, KTX_ORIENTATION_KEY,
                              dimensions + 1,
                              orientation_ktx2);
        ktxHashList_Sort(&kvHash_ktx2);
        ktxHashList_Serialize(&kvHash_ktx2, &kvDataLenAll_ktx2, &kvDataAll_ktx2);
    }